

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int attach_get_offered_capabilities(ATTACH_HANDLE attach,AMQP_VALUE *offered_capabilities_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE single_amqp_value;
  char *pcStack_38;
  int get_single_value_result;
  char *offered_capabilities_single_value;
  AMQP_VALUE item_value;
  ATTACH_INSTANCE *attach_instance;
  uint32_t item_count;
  int result;
  AMQP_VALUE *offered_capabilities_value_local;
  ATTACH_HANDLE attach_local;
  
  if (attach == (ATTACH_HANDLE)0x0) {
    attach_instance._4_4_ = 0x136e;
  }
  else {
    item_value = (AMQP_VALUE)attach;
    _item_count = offered_capabilities_value;
    offered_capabilities_value_local = &attach->composite_value;
    iVar1 = amqpvalue_get_composite_item_count(attach->composite_value,(uint32_t *)&attach_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)attach_instance < 0xc) {
        attach_instance._4_4_ = 0x137c;
      }
      else {
        offered_capabilities_single_value =
             (char *)amqpvalue_get_composite_item_in_place(*(AMQP_VALUE *)item_value,0xb);
        if (((AMQP_VALUE)offered_capabilities_single_value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type((AMQP_VALUE)offered_capabilities_single_value),
           AVar2 == AMQP_TYPE_NULL)) {
          attach_instance._4_4_ = 0x1384;
        }
        else {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)offered_capabilities_single_value);
          if (AVar2 == AMQP_TYPE_ARRAY) {
            memset(&stack0xffffffffffffffc8,0,8);
            single_amqp_value._4_4_ = 1;
          }
          else {
            single_amqp_value._4_4_ =
                 amqpvalue_get_symbol
                           ((AMQP_VALUE)offered_capabilities_single_value,&stack0xffffffffffffffc8);
          }
          AVar2 = amqpvalue_get_type((AMQP_VALUE)offered_capabilities_single_value);
          if (((AVar2 == AMQP_TYPE_ARRAY) &&
              (iVar1 = amqpvalue_get_array((AMQP_VALUE)offered_capabilities_single_value,_item_count
                                          ), iVar1 == 0)) || (single_amqp_value._4_4_ == 0)) {
            AVar2 = amqpvalue_get_type((AMQP_VALUE)offered_capabilities_single_value);
            if (AVar2 == AMQP_TYPE_ARRAY) {
              attach_instance._4_4_ = 0;
            }
            else {
              pAVar3 = amqpvalue_create_array();
              *_item_count = pAVar3;
              if (*_item_count == (AMQP_VALUE)0x0) {
                attach_instance._4_4_ = 0x13a0;
              }
              else {
                pAVar3 = amqpvalue_create_symbol(pcStack_38);
                if (pAVar3 == (AMQP_VALUE)0x0) {
                  attach_instance._4_4_ = 0x13a7;
                }
                else {
                  iVar1 = amqpvalue_add_array_item(*_item_count,pAVar3);
                  if (iVar1 == 0) {
                    iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)item_value,0xb,*_item_count)
                    ;
                    if (iVar1 == 0) {
                      attach_instance._4_4_ = 0;
                    }
                    else {
                      attach_instance._4_4_ = 0x13b3;
                    }
                  }
                  else {
                    attach_instance._4_4_ = 0x13ad;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                amqpvalue_destroy(*_item_count);
              }
            }
          }
          else {
            attach_instance._4_4_ = 0x1397;
          }
        }
      }
    }
    else {
      attach_instance._4_4_ = 0x1376;
    }
  }
  return attach_instance._4_4_;
}

Assistant:

int attach_get_offered_capabilities(ATTACH_HANDLE attach, AMQP_VALUE* offered_capabilities_value)
{
    int result;

    if (attach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach;
        if (amqpvalue_get_composite_item_count(attach_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 11)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(attach_instance->composite_value, 11);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    const char* offered_capabilities_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_symbol(item_value, &offered_capabilities_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&offered_capabilities_single_value, 0, sizeof(offered_capabilities_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, offered_capabilities_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *offered_capabilities_value = amqpvalue_create_array();
                            if (*offered_capabilities_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_symbol(offered_capabilities_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*offered_capabilities_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(attach_instance->composite_value, 11, *offered_capabilities_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*offered_capabilities_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}